

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrologEncoderMD.cpp
# Opt level: O3

uchar PrologEncoderMD::GetNonVolRegToSave(Instr *instr)

{
  Opnd *this;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  undefined4 *puVar4;
  
  if (instr->m_opcode != PUSH) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x40,"(instr->m_opcode == Js::OpCode::PUSH)",
                       "instr->m_opcode == Js::OpCode::PUSH");
    if (!bVar2) goto LAB_0064c452;
    *puVar4 = 0;
  }
  this = instr->m_src1;
  OVar3 = IR::Opnd::GetKind(this);
  if (OVar3 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar2) {
LAB_0064c452:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return *(byte *)((long)&this[1].m_valueType.field_0.bits + 1) - 1;
}

Assistant:

unsigned __int8 PrologEncoderMD::GetNonVolRegToSave(IR::Instr *instr)
{
    Assert(instr->m_opcode == Js::OpCode::PUSH);
    return (instr->GetSrc1()->AsRegOpnd()->GetReg() - 1) & 0xFF;
}